

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void explainSimpleCount(Parse *pParse,Table *pTab,Index *pIdx)

{
  char *pcVar1;
  char *local_48;
  char *zEqp;
  Index *pIdx_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  if (pParse->explain == '\x02') {
    pcVar1 = "";
    if (pIdx == (Index *)0x0) {
      local_48 = "";
    }
    else {
      pcVar1 = "USING COVERING INDEX ";
      local_48 = pIdx->zName;
    }
    pcVar1 = sqlite3MPrintf(pParse->db,"SCAN TABLE %s %s%s(~%d rows)",pTab->zName,pcVar1,local_48,
                            (ulong)pTab->nRowEst);
    sqlite3VdbeAddOp4(pParse->pVdbe,0x96,pParse->iSelectId,0,0,pcVar1,-1);
  }
  return;
}

Assistant:

static void explainSimpleCount(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being queried */
  Index *pIdx                     /* Index used to optimize scan, or NULL */
){
  if( pParse->explain==2 ){
    char *zEqp = sqlite3MPrintf(pParse->db, "SCAN TABLE %s %s%s(~%d rows)",
        pTab->zName, 
        pIdx ? "USING COVERING INDEX " : "",
        pIdx ? pIdx->zName : "",
        pTab->nRowEst
    );
    sqlite3VdbeAddOp4(
        pParse->pVdbe, OP_Explain, pParse->iSelectId, 0, 0, zEqp, P4_DYNAMIC
    );
  }
}